

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t regType,uint32_t regId)

{
  Error EVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (regId < 0x100) {
    if (regType < 0x20) {
      uVar2 = (ulong)regType;
      if (regId < (byte)x86RegFormatInfo[uVar2 * 4 + 3]) {
        pcVar4 = x86RegFormatStrings +
                 (ulong)regId * 4 + (ulong)(byte)x86RegFormatInfo[uVar2 * 4 + 2];
        goto LAB_0015baa7;
      }
      if (regId < (byte)x86RegFormatInfo[uVar2 * 4]) {
        uVar3 = (ulong)regId;
        pcVar4 = x86RegFormatStrings + (byte)x86RegFormatInfo[uVar2 * 4 + 1];
        goto LAB_0015baf0;
      }
    }
    pcVar4 = "PhysReg<Type=%u Id=%u>";
  }
  else {
    if (((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) &&
       (uVar3 = (ulong)(regId - 0x100), uVar3 < emitter[3]._none.field_0._packed[0].u64)) {
      if (regId == 0xffffffff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../base/codecompiler.h"
                   ,0x2a6,"id != kInvalidValue");
      }
      if (*(long *)(emitter[3]._inlineComment + uVar3 * 8) == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86logging.cpp"
                   ,0x222,"vReg != nullptr");
      }
      pcVar4 = *(char **)(*(long *)(emitter[3]._inlineComment + uVar3 * 8) + 8);
      if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
        pcVar4 = "v%u";
LAB_0015baf0:
        EVar1 = StringBuilder::appendFormat(sb,pcVar4,uVar3,in_RAX);
        return EVar1;
      }
LAB_0015baa7:
      EVar1 = StringBuilder::_opString(sb,1,pcVar4,0xffffffffffffffff);
      return EVar1;
    }
    pcVar4 = "VirtReg<Type=%u Id=%u>";
  }
  EVar1 = StringBuilder::appendFormat(sb,pcVar4,regType,(ulong)regId,in_RAX);
  return EVar1;
}

Assistant:

Error Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t regType,
  uint32_t regId) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}